

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
 __thiscall hedg::utils::new_streamer(utils *this,io_service *service,context *context)

{
  Client<hedg::Stream_Client> *this_00;
  system_error e;
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  local_30;
  undefined1 local_21;
  context *local_20;
  context *context_local;
  io_service *service_local;
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  *streamer;
  
  local_21 = 0;
  local_20 = context;
  context_local = (context *)service;
  service_local = (io_service *)this;
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
  ::unique_ptr<std::default_delete<hedg::Client<hedg::Stream_Client>>,void>
            ((unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
              *)this);
  this_00 = (Client<hedg::Stream_Client> *)operator_new(0x2e8);
  Client<hedg::Stream_Client>::Client
            (this_00,(string *)config::stream_host_abi_cxx11_,
             (string *)config::stream_port_abi_cxx11_,(io_service *)context_local,local_20);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
  ::unique_ptr<std::default_delete<hedg::Client<hedg::Stream_Client>>,void>
            ((unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
              *)&local_30,this_00);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::operator=((unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
               *)this,&local_30);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::~unique_ptr(&local_30);
  return (__uniq_ptr_data<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>,_true,_true>
          )(__uniq_ptr_data<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr < Client < Stream_Client> > new_streamer(io_service& service, ssl::context& context) {
		
		std::unique_ptr<Client<Stream_Client> > streamer;
		try {
			streamer = std::move(std::unique_ptr<Client<Stream_Client>>(new Client<Stream_Client>{ config::stream_host, config::stream_port, service, context }));
		}
		catch (boost::system::system_error e) {
			spdlog::error(e.what());
		}	
		return streamer;
	}